

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O0

void consume<long,disruptor::SingleThreadedStrategy,disruptor::YieldingStrategy<200l>>
               (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
                *s,Sequence *seq)

{
  int64_t ev;
  int64_t i;
  int64_t available_seq;
  int64_t localSum;
  int exitCtr;
  int64_t next_seq;
  unique_ptr<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>,_std::default_delete<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>_>_>
  barrier;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> depseqs;
  int64_t *in_stack_ffffffffffffff08;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
  *in_stack_ffffffffffffff10;
  int64_t in_stack_ffffffffffffff18;
  Sequence *in_stack_ffffffffffffff20;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
  *in_stack_ffffffffffffff48;
  long local_b0;
  int local_a4;
  duration<long,std::ratio<1l,1000000l>> local_a0 [12];
  int local_94;
  duration<long,std::ratio<1l,1000000l>> local_90 [8];
  int64_t local_88;
  long local_80;
  int local_74;
  long local_70;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> local_50;
  __int_type local_28;
  long local_20;
  undefined4 local_14;
  long local_10;
  atomic<long> *local_8;
  
  dependents = &local_50;
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x181609);
  disruptor::
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>::
  NewBarrier(in_stack_ffffffffffffff48,dependents);
  local_70 = 0;
  local_74 = 0;
  local_80 = 0;
  while( true ) {
    while( true ) {
      do {
        std::
        unique_ptr<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>,_std::default_delete<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>_>_>
        ::operator->((unique_ptr<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>,_std::default_delete<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>_>_>
                      *)0x181654);
        local_94 = 10000;
        std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_90,&local_94);
        local_88 = disruptor::SequenceBarrier<disruptor::YieldingStrategy<200l>>::
                   WaitFor<long,std::ratio<1l,1000000l>>
                             ((SequenceBarrier<disruptor::YieldingStrategy<200L>_> *)
                              in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                              (duration<long,_std::ratio<1L,_1000000L>_> *)0x181689);
      } while (local_88 < local_70);
      local_88 = disruptor::
                 Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
                 ::GetHighestPublishedSequence
                           (in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08,0x181704);
      if (local_70 <= local_88) break;
      local_74 = local_74 + 1;
      if (10 < local_74) {
        local_a4 = 1;
        std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_a0,&local_a4);
        std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>
                  ((duration<long,_std::ratio<1L,_1000000L>_> *)dependents);
      }
    }
    for (local_b0 = local_70; local_b0 <= local_88; local_b0 = local_b0 + 1) {
      in_stack_ffffffffffffff20 =
           (Sequence *)
           disruptor::
           Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
           ::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_80 = in_stack_ffffffffffffff20->padding0_[0] + local_80;
    }
    disruptor::Sequence::set_sequence(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (local_88 == expectedValue) break;
    local_70 = local_88 + 1;
    local_74 = 0;
  }
  local_8 = &sum;
  local_10 = local_80;
  local_14 = 0;
  local_20 = local_80;
  LOCK();
  local_28 = (__int_type)sum.super___atomic_base<long>._M_i;
  UNLOCK();
  sum.super___atomic_base<long>._M_i =
       (__atomic_base<long>)
       (__atomic_base<long>)(sum.super___atomic_base<long>._M_i + local_80)._M_i;
  std::
  unique_ptr<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>,_std::default_delete<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>_>_>
  ::~unique_ptr((unique_ptr<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>,_std::default_delete<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>_>_>
                 *)&sum);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_ffffffffffffff20);
  return;
}

Assistant:

void consume(disruptor::Sequencer<T, C, W, Alignment>& s, disruptor::Sequence& seq) {
  std::vector<disruptor::Sequence*> depseqs;
  auto barrier = s.NewBarrier(depseqs);

  int64_t next_seq = disruptor::kFirstSequenceValue;

  int exitCtr = 0;
  int64_t localSum = 0;

  while (true) {
#ifdef PRINT_DEBUG_CONS
    std::stringstream ss;
    ss << "Wait for next seq: " << next_seq << ' ' << std::this_thread::get_id()
       << '\n';
    std::cout << ss.str();
#endif

    int64_t available_seq =
        barrier->WaitFor(next_seq, std::chrono::microseconds(10000));

#ifdef PRINT_DEBUG_CONS
    ss.clear();
    ss.str(std::string());
    ss << "Available seq: " << available_seq << ' '
       << std::this_thread::get_id() << '\n';
    std::cout << ss.str();
#endif

    if (available_seq < next_seq) continue;

    // Only required for claim strategy MultiThreadedStrategyEx as it changes
    // the cursor.
    available_seq = s.GetHighestPublishedSequence(next_seq, available_seq);
    if (available_seq < next_seq) {
      ++exitCtr;

#ifdef PRINT_DEBUG_CONS
      ss.clear();
      ss.str(std::string());
      ss << "Highest published seq: " << available_seq << ' '
         << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
      // Otherwise goes into a busy loop with blocking strategy
      if (exitCtr > 10)
        std::this_thread::sleep_for(std::chrono::microseconds(1));
      continue;
    }

    for (int64_t i = next_seq; i <= available_seq; ++i) {
      int64_t ev = s[i];
#ifdef PRINT_DEBUG_CONS
      std::cout << i << " Event: " << ev << '\n';
#endif
      localSum += ev;
    }

    seq.set_sequence(available_seq);

    if (available_seq == expectedValue) break;

    next_seq = available_seq + 1;

    exitCtr = 0;
  }

  sum.fetch_add(localSum, std::memory_order_relaxed);
}